

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O2

Window * __thiscall
s2polyline_alignment::Window::Dilate(Window *__return_storage_ptr__,Window *this,int radius)

{
  pointer pCVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  allocator_type local_39;
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  new_strides;
  
  if (-1 < radius) {
    std::
    vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
    ::vector(&new_strides,(long)this->rows_,&local_39);
    pCVar1 = (this->strides_).
             super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar3 = 0; lVar3 < this->rows_; lVar3 = lVar3 + 1) {
      uVar6 = (int)lVar3 - radius;
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      iVar4 = this->rows_ + -1;
      iVar7 = radius + (int)lVar3;
      if (iVar7 <= iVar4) {
        iVar4 = iVar7;
      }
      iVar7 = pCVar1[uVar6].start - radius;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      iVar5 = pCVar1[iVar4].end + radius;
      iVar4 = this->cols_;
      if (iVar5 <= this->cols_) {
        iVar4 = iVar5;
      }
      new_strides.
      super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar3].start = iVar7;
      new_strides.
      super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar3].end = iVar4;
    }
    Window(__return_storage_ptr__,&new_strides);
    std::
    _Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
    ::~_Vector_base(&new_strides.
                     super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                   );
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&new_strides,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
             ,0x5c,kFatal,(ostream *)&std::cerr);
  poVar2 = std::operator<<((ostream *)
                           new_strides.
                           super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                           ._M_impl.super__Vector_impl_data._M_finish,"Check failed: radius >= 0 ");
  std::operator<<(poVar2,"Negative dilation radius.");
  abort();
}

Assistant:

Window Window::Dilate(const int radius) const {
  S2_DCHECK(radius >= 0) << "Negative dilation radius.";
  std::vector<ColumnStride> new_strides(rows_);
  int prev_row, next_row;
  for (int row = 0; row < rows_; ++row) {
    prev_row = std::max(0, row - radius);
    next_row = std::min(row + radius, rows_ - 1);
    new_strides[row] = {std::max(0, strides_[prev_row].start - radius),
                        std::min(strides_[next_row].end + radius, cols_)};
  }
  return Window(new_strides);
}